

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::out<double,3ul>(ChArchiveOut *this,ChNameValue<double[3]> *bVal)

{
  double (*padVar1) [3];
  char *mname;
  char *pcVar2;
  ChNameValue<double> local_b8;
  undefined1 local_a0 [8];
  ChNameValue<double> array_val;
  char buffer [20];
  size_t i;
  undefined1 local_58 [8];
  ChValueSpecific<double[3]> specVal;
  size_t arraysize;
  ChNameValue<double[3]> *bVal_local;
  ChArchiveOut *this_local;
  
  specVal._ptr_to_val = (double (*) [3])0x3;
  padVar1 = ChNameValue<double[3]>::value(bVal);
  mname = ChNameValue<double[3]>::name(bVal);
  pcVar2 = ChNameValue<double[3]>::flags(bVal);
  ChValueSpecific<double[3]>::ChValueSpecific
            ((ChValueSpecific<double[3]> *)local_58,padVar1,mname,*pcVar2);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,(ChValueSpecific<double[3]> *)local_58,specVal._ptr_to_val);
  for (stack0xffffffffffffff90 = (double (*) [3])0x0; stack0xffffffffffffff90 < specVal._ptr_to_val;
      register0x00000000 = (double (*) [3])((long)*stack0xffffffffffffff90 + 1)) {
    sprintf(&array_val._flags,"%lu",stack0xffffffffffffff90);
    padVar1 = ChNameValue<double[3]>::value(bVal);
    ChNameValue<double>::ChNameValue
              ((ChNameValue<double> *)local_a0,&array_val._flags,
               *padVar1 + (long)stack0xffffffffffffff90,'\0');
    ChNameValue<double>::ChNameValue(&local_b8,(ChNameValue<double> *)local_a0);
    (*(this->super_ChArchive)._vptr_ChArchive[4])(this,&local_b8);
    ChNameValue<double>::~ChNameValue(&local_b8);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,local_58,specVal._ptr_to_val);
    ChNameValue<double>::~ChNameValue((ChNameValue<double> *)local_a0);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,local_58,specVal._ptr_to_val);
  ChValueSpecific<double[3]>::~ChValueSpecific((ChValueSpecific<double[3]> *)local_58);
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }